

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_fs_open(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  uv_loop_t *loop;
  char *pcVar5;
  undefined1 auVar6 [16];
  uv_os_fd_t dup_fd;
  uv_os_fd_t fd;
  undefined1 local_498 [16];
  char dev_null [10];
  uv_stdio_container_t stdio [1];
  uv_pipe_t in;
  uv_fs_t fs_req;
  uv_write_t write_req2;
  uv_write_t write_req;
  
  builtin_strncpy(dev_null,"/dev/null",10);
  iVar1 = uv_fs_open(0,&fs_req,dev_null,2,0,0);
  if (iVar1 == -1) {
    pcVar5 = "r != -1";
    uVar4 = 0x63d;
  }
  else {
    iVar2 = uv_get_osfhandle((undefined4)fs_req.result);
    fd = iVar2;
    uv_fs_req_cleanup(&fs_req);
    init_process_options("spawn_helper8",exit_cb);
    uVar4 = uv_default_loop();
    iVar3 = uv_pipe_init(uVar4,(uv_stream_t *)&in,0);
    if (iVar3 == 0) {
      options.stdio = stdio;
      stdio[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
      options.stdio_count = 1;
      stdio[0].data.stream = (uv_stream_t *)&in;
      dup_fd = dup(iVar2);
      uVar4 = uv_default_loop();
      iVar2 = uv_spawn(uVar4,&process,&options);
      if (iVar2 == 0) {
        local_498 = uv_buf_init(&fd,4);
        iVar2 = uv_write(&write_req,&in,local_498,1,write_null_cb);
        if (iVar2 == 0) {
          auVar6 = uv_buf_init(&dup_fd,4);
          local_498 = auVar6;
          iVar2 = uv_write(&write_req2,&in,local_498,1,write_cb);
          if (iVar2 == 0) {
            uVar4 = uv_default_loop();
            iVar2 = uv_run(uVar4,0);
            if (iVar2 == 0) {
              iVar1 = uv_fs_close(0,&fs_req,iVar1,0);
              if (iVar1 == 0) {
                if (exit_cb_called == 1) {
                  if (close_cb_called == 2) {
                    loop = (uv_loop_t *)uv_default_loop();
                    close_loop(loop);
                    uVar4 = uv_default_loop();
                    iVar1 = uv_loop_close(uVar4);
                    if (iVar1 == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar5 = "0 == uv_loop_close(uv_default_loop())";
                    uVar4 = 0x664;
                  }
                  else {
                    pcVar5 = "close_cb_called == 2";
                    uVar4 = 0x662;
                  }
                }
                else {
                  pcVar5 = "exit_cb_called == 1";
                  uVar4 = 0x661;
                }
              }
              else {
                pcVar5 = "0 == uv_fs_close(NULL, &fs_req, r, NULL)";
                uVar4 = 0x65f;
              }
            }
            else {
              pcVar5 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
              uVar4 = 0x65e;
            }
          }
          else {
            pcVar5 = "0 == uv_write(&write_req2, (uv_stream_t*) &in, &buf, 1, write_cb)";
            uVar4 = 0x65c;
          }
        }
        else {
          pcVar5 = "0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_null_cb)";
          uVar4 = 0x659;
        }
      }
      else {
        pcVar5 = "0 == uv_spawn(uv_default_loop(), &process, &options)";
        uVar4 = 0x656;
      }
    }
    else {
      pcVar5 = "0 == uv_pipe_init(uv_default_loop(), &in, 0)";
      uVar4 = 0x643;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c",
          uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(spawn_fs_open) {
  int r;
  uv_os_fd_t fd;
  uv_os_fd_t dup_fd;
  uv_fs_t fs_req;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_write_t write_req2;
  uv_buf_t buf;
  uv_stdio_container_t stdio[1];
#ifdef _WIN32
  const char dev_null[] = "NUL";
  HMODULE kernelbase_module;
  sCompareObjectHandles pCompareObjectHandles; /* function introduced in Windows 10 */
#else
  const char dev_null[] = "/dev/null";
#endif

  r = uv_fs_open(NULL, &fs_req, dev_null, O_RDWR, 0, NULL);
  ASSERT(r != -1);
  fd = uv_get_osfhandle((uv_file) fs_req.result);
  uv_fs_req_cleanup(&fs_req);

  init_process_options("spawn_helper8", exit_cb);

  ASSERT(0 == uv_pipe_init(uv_default_loop(), &in, 0));

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  /* make an inheritable copy */
#ifdef _WIN32
  ASSERT(0 != DuplicateHandle(GetCurrentProcess(), fd, GetCurrentProcess(), &dup_fd,
                              0, /* inherit */ TRUE, DUPLICATE_SAME_ACCESS));
  kernelbase_module = GetModuleHandleA("kernelbase.dll");
  pCompareObjectHandles = (sCompareObjectHandles)
      GetProcAddress(kernelbase_module, "CompareObjectHandles");
  ASSERT(pCompareObjectHandles == NULL || pCompareObjectHandles(fd, dup_fd));
#else
  dup_fd = dup(fd);
#endif

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init((char*) &fd, sizeof(fd));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_null_cb));

  buf = uv_buf_init((char*) &dup_fd, sizeof(fd));
  ASSERT(0 == uv_write(&write_req2, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_fs_close(NULL, &fs_req, r, NULL));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2);  /* One for `in`, one for process */

  MAKE_VALGRIND_HAPPY();
  return 0;
}